

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

int buildRequestHttpHeadersHandle
              (HTTPAPIEX_HANDLE_DATA *handleData,BUFFER_HANDLE requestContent,
              HTTP_HEADERS_HANDLE originalRequestHttpHeadersHandle,
              _Bool *isOriginalRequestHttpHeadersHandle,
              HTTP_HEADERS_HANDLE *toBeUsedRequestHttpHeadersHandle)

{
  HTTP_HEADERS_RESULT HVar1;
  HTTP_HEADERS_HANDLE pHVar2;
  size_t value;
  char *value_00;
  char local_58 [8];
  char temp [22];
  LOGGER_LOG l;
  int result;
  HTTP_HEADERS_HANDLE *toBeUsedRequestHttpHeadersHandle_local;
  _Bool *isOriginalRequestHttpHeadersHandle_local;
  HTTP_HEADERS_HANDLE originalRequestHttpHeadersHandle_local;
  BUFFER_HANDLE requestContent_local;
  HTTPAPIEX_HANDLE_DATA *handleData_local;
  
  if (originalRequestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
    *isOriginalRequestHttpHeadersHandle = false;
    pHVar2 = HTTPHeaders_Alloc();
    *toBeUsedRequestHttpHeadersHandle = pHVar2;
  }
  else {
    *toBeUsedRequestHttpHeadersHandle = originalRequestHttpHeadersHandle;
    *isOriginalRequestHttpHeadersHandle = true;
  }
  if (*toBeUsedRequestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
    l._4_4_ = 0x95;
    register0x00000000 = xlogging_get_log_function();
    if (register0x00000000 != (LOGGER_LOG)0x0) {
      (*register0x00000000)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                 ,"buildRequestHttpHeadersHandle",0x96,1,"unable to HTTPHeaders_Alloc");
    }
  }
  else {
    memset(local_58,0,0x16);
    value = BUFFER_length(requestContent);
    size_tToString(local_58,0x16,value);
    pHVar2 = *toBeUsedRequestHttpHeadersHandle;
    value_00 = STRING_c_str(handleData->hostName);
    HVar1 = HTTPHeaders_ReplaceHeaderNameValuePair(pHVar2,"Host",value_00);
    if ((HVar1 == HTTP_HEADERS_OK) &&
       (HVar1 = HTTPHeaders_ReplaceHeaderNameValuePair
                          (*toBeUsedRequestHttpHeadersHandle,"Content-Length",local_58),
       HVar1 == HTTP_HEADERS_OK)) {
      l._4_4_ = 0;
    }
    else {
      if ((*isOriginalRequestHttpHeadersHandle & 1U) == 0) {
        HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
      }
      *toBeUsedRequestHttpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
      l._4_4_ = 0xae;
    }
  }
  return l._4_4_;
}

Assistant:

static int buildRequestHttpHeadersHandle(HTTPAPIEX_HANDLE_DATA *handleData, BUFFER_HANDLE requestContent, HTTP_HEADERS_HANDLE originalRequestHttpHeadersHandle, bool* isOriginalRequestHttpHeadersHandle, HTTP_HEADERS_HANDLE* toBeUsedRequestHttpHeadersHandle)
{
    int result;


    if (originalRequestHttpHeadersHandle != NULL)
    {
        *toBeUsedRequestHttpHeadersHandle = originalRequestHttpHeadersHandle;
        *isOriginalRequestHttpHeadersHandle = true;

    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_009: [If parameter requestHttpHeadersHandle is NULL then HTTPAPIEX_ExecuteRequest shall allocate a temporary internal instance of HTTPHEADERS, shall add to that instance the following headers
        Host:{hostname} - as it was indicated by the call to HTTPAPIEX_Create API call
        Content-Length:the size of the requestContent parameter, and use this instance to all the subsequent calls to HTTPAPI_ExecuteRequest as parameter httpHeadersHandle.]
        */
        *isOriginalRequestHttpHeadersHandle = false;
        *toBeUsedRequestHttpHeadersHandle = HTTPHeaders_Alloc();
    }

    if (*toBeUsedRequestHttpHeadersHandle == NULL)
    {
        result = MU_FAILURE;
        LogError("unable to HTTPHeaders_Alloc");
    }
    else
    {
        char temp[22] = { 0 };
        (void)size_tToString(temp, 22, BUFFER_length(requestContent)); /*cannot fail, MAX_uint64 has 19 digits*/
        /*Codes_SRS_HTTPAPIEX_02_011: [If parameter requestHttpHeadersHandle is not NULL then HTTPAPIEX_ExecuteRequest shall create or update the following headers of the request:
        Host:{hostname}
        Content-Length:the size of the requestContent parameter, and shall use the so constructed HTTPHEADERS object to all calls to HTTPAPI_ExecuteRequest as parameter httpHeadersHandle.]
        */
        /*Codes_SRS_HTTPAPIEX_02_009: [If parameter requestHttpHeadersHandle is NULL then HTTPAPIEX_ExecuteRequest shall allocate a temporary internal instance of HTTPHEADERS, shall add to that instance the following headers
        Host:{hostname} - as it was indicated by the call to HTTPAPIEX_Create API call
        Content-Length:the size of the requestContent parameter, and use this instance to all the subsequent calls to HTTPAPI_ExecuteRequest as parameter httpHeadersHandle.]
        */
        if (!(
            (HTTPHeaders_ReplaceHeaderNameValuePair(*toBeUsedRequestHttpHeadersHandle, "Host", STRING_c_str(handleData->hostName)) == HTTP_HEADERS_OK) &&
            (HTTPHeaders_ReplaceHeaderNameValuePair(*toBeUsedRequestHttpHeadersHandle, "Content-Length", temp) == HTTP_HEADERS_OK)
            ))
        {
            if (! *isOriginalRequestHttpHeadersHandle)
            {
                HTTPHeaders_Free(*toBeUsedRequestHttpHeadersHandle);
            }
            *toBeUsedRequestHttpHeadersHandle = NULL;
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}